

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_smooth.c
# Opt level: O1

REF_STATUS ref_smooth_tet_improve(REF_GRID ref_grid,REF_INT node)

{
  REF_NODE pRVar1;
  REF_INTERP pRVar2;
  REF_ADJ pRVar3;
  REF_NODE ref_node;
  REF_DBL *pRVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  long lVar12;
  int iVar13;
  int iVar14;
  double dVar15;
  REF_INT nnode;
  REF_DBL max_ratio;
  REF_DBL min_ratio;
  REF_DBL quality0;
  REF_DBL original [3];
  REF_DBL ideal [3];
  REF_DBL quality;
  int local_27c;
  double local_278;
  double local_270;
  double local_268;
  REF_INTERP local_260;
  long local_258;
  long local_250;
  long local_248;
  double local_240;
  REF_DBL local_238 [4];
  REF_DBL local_218 [4];
  double local_1f8;
  undefined8 uStack_1f0;
  REF_DBL local_1e8 [4];
  double local_1c8 [51];
  
  pRVar1 = ref_grid->node;
  pRVar2 = ref_grid->interp;
  if ((node < 0) ||
     ((((((pRVar3 = ref_grid->cell[3]->ref_adj, pRVar3->nnode <= node ||
          (pRVar3->first[(uint)node] == -1)) &&
         ((pRVar3 = ref_grid->cell[6]->ref_adj, pRVar3->nnode <= node ||
          (pRVar3->first[(uint)node] == -1)))) &&
        ((pRVar3 = ref_grid->cell[9]->ref_adj, pRVar3->nnode <= node ||
         (pRVar3->first[(uint)node] == -1)))) &&
       ((pRVar3 = ref_grid->cell[10]->ref_adj, pRVar3->nnode <= node ||
        (pRVar3->first[(uint)node] == -1)))) &&
      ((pRVar3 = ref_grid->cell[0xb]->ref_adj, pRVar3->nnode <= node ||
       (pRVar3->first[(uint)node] == -1)))))) {
    local_238[2] = pRVar1->real[(long)(node * 0xf) + 2];
    pRVar4 = pRVar1->real + node * 0xf;
    local_238[0] = *pRVar4;
    local_238[1] = pRVar4[1];
    iVar13 = -1;
    if ((pRVar2 != (REF_INTERP)0x0) && (pRVar2->continuously != 0)) {
      iVar13 = pRVar2->cell[node];
    }
    uVar8 = ref_smooth_tet_quality_around(ref_grid,node,&local_240);
    if (uVar8 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c",
             0x5ba,"ref_smooth_tet_improve",(ulong)uVar8,"q");
      return uVar8;
    }
    uVar8 = ref_smooth_tet_ratio_around(ref_grid,node,&local_270,&local_278);
    if (uVar8 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c",
             0x5bc,"ref_smooth_tet_improve",(ulong)uVar8,"ratio");
      return uVar8;
    }
    bVar6 = false;
    local_268 = local_240;
    if ((0.5 < local_240) && (0.5 < local_270)) {
      bVar6 = local_278 < 2.0;
    }
    local_260 = pRVar2;
    if (bVar6) {
      ref_node = ref_grid->node;
      uVar8 = ref_cell_node_list_around(ref_grid->cell[8],node,100,&local_27c,(REF_INT *)local_1c8);
      uVar11 = (ulong)uVar8;
      if (uVar8 == 0) {
        local_218[0] = 0.0;
        local_218[1] = 0.0;
        local_218[2] = 0.0;
        if (0 < local_27c) {
          lVar12 = 0;
          do {
            uVar8 = ref_smooth_add_pliant_force
                              (ref_node,node,*(REF_INT *)((long)local_1c8 + lVar12 * 4),local_218);
            if (uVar8 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                     ,0x58f,"ref_smooth_tet_pliant",(ulong)uVar8,"edge");
              uVar11 = (ulong)uVar8;
              goto LAB_001e367a;
            }
            lVar12 = lVar12 + 1;
          } while (lVar12 < local_27c);
        }
        pRVar4 = ref_node->real;
        dVar15 = ref_grid->adapt->smooth_pliant_alpha;
        uVar11 = 0;
        lVar12 = 0;
        do {
          local_1e8[lVar12] = local_218[lVar12] * dVar15 + pRVar4[node * 0xf + lVar12];
          lVar12 = lVar12 + 1;
        } while (lVar12 != 3);
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c",
               0x589,"ref_smooth_tet_pliant",uVar11,"node list for pliant tet edges");
      }
LAB_001e367a:
      if ((int)uVar11 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c",
               0x5c0,"ref_smooth_tet_improve",uVar11,"pliant");
        return (int)uVar11;
      }
    }
    else {
      uVar8 = ref_smooth_tet_weighted_ideal(ref_grid,node,local_1e8);
      if (uVar8 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c",
               0x5c2,"ref_smooth_tet_improve",(ulong)uVar8,"ideal");
        return uVar8;
      }
    }
    local_1f8 = local_268 * 0.9;
    uStack_1f0 = 0;
    local_250 = (long)node;
    local_258 = (long)(node * 0xf);
    dVar15 = 1.0;
    local_248 = local_258 * 8;
    iVar14 = 0;
    uVar8 = 0;
    do {
      pRVar4 = pRVar1->real;
      lVar12 = 0;
      do {
        *(double *)((long)pRVar4 + lVar12 * 8 + local_248) =
             local_1e8[lVar12] * dVar15 + local_238[lVar12] * (1.0 - dVar15);
        lVar12 = lVar12 + 1;
      } while (lVar12 != 3);
      uVar9 = ref_metric_interpolate_node(ref_grid,node);
      if ((uVar9 != 0) && (uVar9 != 5)) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c",
               0x5ca,"ref_smooth_tet_improve",(ulong)uVar9,"ref_metric_interpolate_node failed");
        uVar8 = uVar9;
      }
      if ((uVar9 != 5) && (uVar9 != 0)) {
        return uVar8;
      }
      uVar10 = ref_smooth_tet_quality_around(ref_grid,node,local_1c8);
      if (uVar10 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c",
               0x5cb,"ref_smooth_tet_improve",(ulong)uVar10,"q");
        return uVar10;
      }
      uVar10 = ref_smooth_tet_ratio_around(ref_grid,node,&local_270,&local_278);
      if (uVar10 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c",
               0x5cd,"ref_smooth_tet_improve",(ulong)uVar10,"ratio");
        return uVar10;
      }
      if (uVar9 == 0) {
        if (ref_grid->adapt->post_min_ratio <= local_270) {
          bVar5 = local_278 <= ref_grid->adapt->post_max_ratio;
        }
        else {
          bVar5 = false;
        }
      }
      else {
        bVar5 = false;
      }
      if (bVar6) {
        bVar7 = local_1f8 < local_1c8[0] && 0.4 < local_1c8[0];
      }
      else {
        bVar7 = local_268 < local_1c8[0];
      }
      if ((bool)(bVar5 & bVar7)) {
        return 0;
      }
      dVar15 = dVar15 * 0.5;
      if (uVar9 != 0 && iVar13 != -1) {
        local_260->cell[local_250] = iVar13;
      }
      iVar14 = iVar14 + 1;
    } while (iVar14 != 8);
    pRVar4 = pRVar1->real;
    pRVar4[local_258 + 2] = local_238[2];
    pRVar4 = pRVar4 + local_258;
    *pRVar4 = local_238[0];
    pRVar4[1] = local_238[1];
    uVar9 = ref_metric_interpolate_node(ref_grid,node);
    if ((uVar9 != 0) && (uVar9 != 5)) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c",
             0x5e1,"ref_smooth_tet_improve",(ulong)uVar9,"interp");
      uVar8 = uVar9;
    }
    if ((uVar9 != 5) && (uVar9 != 0)) {
      return uVar8;
    }
  }
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_smooth_tet_improve(REF_GRID ref_grid, REF_INT node) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_INT tries;
  REF_DBL ideal[3], original[3];
  REF_DBL backoff, quality0, quality, min_ratio, max_ratio;
  REF_INT ixyz;
  REF_STATUS interp_status;
  REF_INT interp_guess;
  REF_INTERP ref_interp = ref_grid_interp(ref_grid);
  REF_BOOL pliant_smoothing;
  REF_BOOL accept;

  /* can't handle boundaries yet */
  if (!ref_cell_node_empty(ref_grid_tri(ref_grid), node) ||
      !ref_cell_node_empty(ref_grid_qua(ref_grid), node))
    return REF_SUCCESS;

  /* can't mixed elements */
  if (!ref_cell_node_empty(ref_grid_pyr(ref_grid), node) ||
      !ref_cell_node_empty(ref_grid_pri(ref_grid), node) ||
      !ref_cell_node_empty(ref_grid_hex(ref_grid), node))
    return REF_SUCCESS;

  for (ixyz = 0; ixyz < 3; ixyz++)
    original[ixyz] = ref_node_xyz(ref_node, ixyz, node);
  interp_guess = REF_EMPTY;
  if (NULL != ref_interp) {
    if (ref_interp_continuously(ref_interp)) {
      interp_guess = ref_interp_cell(ref_interp, node);
    }
  }

  RSS(ref_smooth_tet_quality_around(ref_grid, node, &quality0), "q");
  RSS(ref_smooth_tet_ratio_around(ref_grid, node, &min_ratio, &max_ratio),
      "ratio");
  pliant_smoothing = (quality0 > 0.5 && min_ratio > 0.5 && max_ratio < 2.0);

  if (pliant_smoothing) {
    RSS(ref_smooth_tet_pliant(ref_grid, node, ideal), "pliant");
  } else {
    RSS(ref_smooth_tet_weighted_ideal(ref_grid, node, ideal), "ideal");
  }
  backoff = 1.0;
  for (tries = 0; tries < 8; tries++) {
    for (ixyz = 0; ixyz < 3; ixyz++)
      ref_node_xyz(ref_node, ixyz, node) =
          backoff * ideal[ixyz] + (1.0 - backoff) * original[ixyz];
    interp_status = ref_metric_interpolate_node(ref_grid, node);
    RXS(interp_status, REF_NOT_FOUND, "ref_metric_interpolate_node failed");
    RSS(ref_smooth_tet_quality_around(ref_grid, node, &quality), "q");
    RSS(ref_smooth_tet_ratio_around(ref_grid, node, &min_ratio, &max_ratio),
        "ratio");
    accept = (REF_SUCCESS == interp_status);
    accept = accept && (min_ratio >= ref_grid_adapt(ref_grid, post_min_ratio));
    accept = accept && (max_ratio <= ref_grid_adapt(ref_grid, post_max_ratio));
    if (pliant_smoothing) {
      accept = accept && (quality > 0.9 * quality0);
      accept = accept && (quality > 0.4);
    } else {
      accept = accept && (quality > quality0);
    }
    if (accept) {
      return REF_SUCCESS;
    }
    backoff *= 0.5;
    if (REF_EMPTY != interp_guess && REF_SUCCESS != interp_status)
      ref_interp_cell(ref_interp, node) = interp_guess;
  }

  for (ixyz = 0; ixyz < 3; ixyz++)
    ref_node_xyz(ref_node, ixyz, node) = original[ixyz];
  RXS(ref_metric_interpolate_node(ref_grid, node), REF_NOT_FOUND, "interp");

  return REF_SUCCESS;
}